

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

void leveldb::anon_unknown_4::MTThreadBody(void *arg)

{
  undefined8 *puVar1;
  ulong uVar2;
  uint uVar3;
  int line;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  undefined8 local_6c8;
  undefined8 *puStack_6c0;
  int w;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_6b0;
  size_t local_6a8;
  AssertHelper local_6a0;
  int k;
  int key;
  string value;
  Status s;
  int c;
  long *local_648;
  long local_640;
  char keybuf [20];
  char valbuf [1500];
  
  uVar7 = *(uint *)((long)arg + 8);
  uVar4 = (ulong)uVar7;
  local_648 = *(long **)(**arg + 0x38);
  fprintf(_stderr,"... starting thread %d\n",uVar4);
  uVar5 = uVar7 + 1000 & 0x7fffffff;
  uVar2 = (ulong)uVar5;
  if ((uVar5 == 0x7fffffff) || (uVar5 == 0)) {
    uVar2 = 1;
  }
  local_640 = (long)(int)uVar7;
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  if ((*(byte *)(*arg + 8) & 1) == 0) {
    uVar7 = 0;
    do {
      *(uint *)(*arg + 0xc + local_640 * 4) = uVar7;
      uVar3 = (int)(uVar2 * 0x41a7 >> 0x1f) + ((uint)(uVar2 * 0x41a7) & 0x7fffffff);
      uVar5 = uVar3 + 0x80000001;
      if (-1 < (int)uVar3) {
        uVar5 = uVar3;
      }
      uVar2 = (ulong)uVar5 % 1000;
      key = (int)uVar2;
      snprintf(keybuf,0x14,"%016d",uVar2);
      uVar2 = (ulong)uVar5 * 0x41a7;
      uVar3 = (int)(uVar2 >> 0x1f) + ((uint)uVar2 & 0x7fffffff);
      uVar5 = uVar3 + 0x80000001;
      if (-1 < (int)uVar3) {
        uVar5 = uVar3;
      }
      uVar2 = (ulong)uVar5;
      if ((uVar5 & 1) == 0) {
        snprintf(valbuf,0x5dc,"%d.%d.%-1000d",(ulong)(uint)key,uVar4,(ulong)uVar7);
        w = w & 0xffffff00;
        local_6b0._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)keybuf;
        local_6a8 = strlen(keybuf);
        s.state_ = valbuf;
        strlen(valbuf);
        (**(code **)(*local_648 + 0x10))(&local_6a0,local_648,&w,&local_6b0,&s);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_6c8,
                   (char *)&k,(Status *)"db->Put(WriteOptions(), Slice(keybuf), Slice(valbuf))");
        if ((void *)CONCAT44(local_6a0.data_._4_4_,local_6a0.data_._0_4_) != (void *)0x0) {
          operator_delete__((void *)CONCAT44(local_6a0.data_._4_4_,local_6a0.data_._0_4_));
        }
        puVar1 = puStack_6c0;
        if (local_6c8._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
          testing::Message::Message((Message *)&local_6b0);
          if (puStack_6c0 == (undefined8 *)0x0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = (char *)*puStack_6c0;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&s,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                     ,0x7ab,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)&s,(Message *)&local_6b0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s);
          if (local_6b0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_6b0._M_head_impl + 8))();
          }
          puVar1 = puStack_6c0;
          if (puStack_6c0 != (undefined8 *)0x0) {
            if ((undefined8 *)*puStack_6c0 != puStack_6c0 + 2) {
              operator_delete((undefined8 *)*puStack_6c0);
            }
            operator_delete(puVar1);
          }
          goto LAB_0010d494;
        }
        if (puStack_6c0 != (undefined8 *)0x0) {
          if ((undefined8 *)*puStack_6c0 != puStack_6c0 + 2) {
            operator_delete((undefined8 *)*puStack_6c0);
          }
          operator_delete(puVar1);
        }
      }
      else {
        puStack_6c0 = (undefined8 *)0x0;
        local_6c8 = 0x100;
        local_6b0._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)keybuf;
        local_6a8 = strlen(keybuf);
        (**(code **)(*local_648 + 0x28))(&s,local_648,&local_6c8,&local_6b0,&value);
        if ((s.state_ == (char *)0x0) || (s.state_[4] != '\x01')) {
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_6c8,
                     (char *)&local_6b0,(Status *)0x185daa);
          puVar1 = puStack_6c0;
          if (local_6c8._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
            testing::Message::Message((Message *)&local_6b0);
            if (puStack_6c0 == (undefined8 *)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = (char *)*puStack_6c0;
            }
            line = 0x7b3;
          }
          else {
            if (puStack_6c0 != (undefined8 *)0x0) {
              if ((undefined8 *)*puStack_6c0 != puStack_6c0 + 2) {
                operator_delete((undefined8 *)*puStack_6c0);
              }
              operator_delete(puVar1);
            }
            local_6b0._M_head_impl._0_4_ = 3;
            local_6a0.data_._0_4_ = __isoc99_sscanf(value._M_dataplus._M_p,"%d.%d.%d",&k,&w,&c);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&local_6c8,"3","sscanf(value.c_str(), \"%d.%d.%d\", &k, &w, &c)",
                       (int *)&local_6b0,(int *)&local_6a0);
            puVar1 = puStack_6c0;
            if (local_6c8._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
              testing::Message::Message((Message *)&local_6b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_6b0._M_head_impl + 0x10),value._M_dataplus._M_p,
                         value._M_string_length);
              if (puStack_6c0 == (undefined8 *)0x0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = (char *)*puStack_6c0;
              }
              line = 0x7b5;
            }
            else {
              if (puStack_6c0 != (undefined8 *)0x0) {
                if ((undefined8 *)*puStack_6c0 != puStack_6c0 + 2) {
                  operator_delete((undefined8 *)*puStack_6c0);
                }
                operator_delete(puVar1);
              }
              testing::internal::CmpHelperEQ<int,int>((internal *)&local_6c8,"k","key",&k,&key);
              puVar1 = puStack_6c0;
              if (local_6c8._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0)
              {
                testing::Message::Message((Message *)&local_6b0);
                if (puStack_6c0 == (undefined8 *)0x0) {
                  pcVar6 = "";
                }
                else {
                  pcVar6 = (char *)*puStack_6c0;
                }
                line = 0x7b6;
              }
              else {
                if (puStack_6c0 != (undefined8 *)0x0) {
                  if ((undefined8 *)*puStack_6c0 != puStack_6c0 + 2) {
                    operator_delete((undefined8 *)*puStack_6c0);
                  }
                  operator_delete(puVar1);
                }
                local_6b0._M_head_impl = local_6b0._M_head_impl & 0xffffffff00000000;
                testing::internal::CmpHelperGE<int,int>
                          ((internal *)&local_6c8,"w","0",&w,(int *)&local_6b0);
                puVar1 = puStack_6c0;
                if (local_6c8._0_1_ ==
                    (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
                  testing::Message::Message((Message *)&local_6b0);
                  if (puStack_6c0 == (undefined8 *)0x0) {
                    pcVar6 = "";
                  }
                  else {
                    pcVar6 = (char *)*puStack_6c0;
                  }
                  line = 0x7b7;
                }
                else {
                  if (puStack_6c0 != (undefined8 *)0x0) {
                    if ((undefined8 *)*puStack_6c0 != puStack_6c0 + 2) {
                      operator_delete((undefined8 *)*puStack_6c0);
                    }
                    operator_delete(puVar1);
                  }
                  testing::internal::CmpHelperLT<int,int>
                            ((internal *)&local_6c8,"w","kNumThreads",&w,
                             &(anonymous_namespace)::kNumThreads);
                  puVar1 = puStack_6c0;
                  if (local_6c8._0_1_ ==
                      (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
                    testing::Message::Message((Message *)&local_6b0);
                    if (puStack_6c0 == (undefined8 *)0x0) {
                      pcVar6 = "";
                    }
                    else {
                      pcVar6 = (char *)*puStack_6c0;
                    }
                    line = 0x7b8;
                  }
                  else {
                    if (puStack_6c0 != (undefined8 *)0x0) {
                      if ((undefined8 *)*puStack_6c0 != puStack_6c0 + 2) {
                        operator_delete((undefined8 *)*puStack_6c0);
                      }
                      operator_delete(puVar1);
                    }
                    local_6b0._M_head_impl._0_4_ = *(undefined4 *)(*arg + 0xc + (long)w * 4);
                    testing::internal::CmpHelperLE<int,int>
                              ((internal *)&local_6c8,"c",
                               "t->state->counter[w].load(std::memory_order_acquire)",&c,
                               (int *)&local_6b0);
                    puVar1 = puStack_6c0;
                    if (local_6c8._0_1_ !=
                        (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
                      if (puStack_6c0 != (undefined8 *)0x0) {
                        if ((undefined8 *)*puStack_6c0 != puStack_6c0 + 2) {
                          operator_delete((undefined8 *)*puStack_6c0);
                        }
                        operator_delete(puVar1);
                      }
                      if (s.state_ == (char *)0x0) goto LAB_0010d182;
                      goto LAB_0010d17d;
                    }
                    testing::Message::Message((Message *)&local_6b0);
                    if (puStack_6c0 == (undefined8 *)0x0) {
                      pcVar6 = "";
                    }
                    else {
                      pcVar6 = (char *)*puStack_6c0;
                    }
                    line = 0x7b9;
                  }
                }
              }
            }
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_6a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                     ,line,pcVar6);
          testing::internal::AssertHelper::operator=(&local_6a0,(Message *)&local_6b0);
          testing::internal::AssertHelper::~AssertHelper(&local_6a0);
          if (local_6b0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_6b0._M_head_impl + 8))();
          }
          puVar1 = puStack_6c0;
          if (puStack_6c0 != (undefined8 *)0x0) {
            if ((undefined8 *)*puStack_6c0 != puStack_6c0 + 2) {
              operator_delete((undefined8 *)*puStack_6c0);
            }
            operator_delete(puVar1);
          }
          if (s.state_ != (char *)0x0) {
            operator_delete__(s.state_);
          }
          goto LAB_0010d494;
        }
LAB_0010d17d:
        operator_delete__(s.state_);
      }
LAB_0010d182:
      uVar7 = uVar7 + 1;
    } while ((*(byte *)(*arg + 8) & 1) == 0);
  }
  else {
    uVar7 = 0;
  }
  *(undefined1 *)(*arg + 0x1c + local_640) = 1;
  fprintf(_stderr,"... stopping thread %d after %d ops\n",uVar4,(ulong)uVar7);
LAB_0010d494:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)value._M_dataplus._M_p != &value.field_2) {
    operator_delete(value._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void MTThreadBody(void* arg) {
  MTThread* t = reinterpret_cast<MTThread*>(arg);
  int id = t->id;
  DB* db = t->state->test->db_;
  int counter = 0;
  std::fprintf(stderr, "... starting thread %d\n", id);
  Random rnd(1000 + id);
  std::string value;
  char valbuf[1500];
  while (!t->state->stop.load(std::memory_order_acquire)) {
    t->state->counter[id].store(counter, std::memory_order_release);

    int key = rnd.Uniform(kNumKeys);
    char keybuf[20];
    std::snprintf(keybuf, sizeof(keybuf), "%016d", key);

    if (rnd.OneIn(2)) {
      // Write values of the form <key, my id, counter>.
      // We add some padding for force compactions.
      std::snprintf(valbuf, sizeof(valbuf), "%d.%d.%-1000d", key, id,
                    static_cast<int>(counter));
      ASSERT_LEVELDB_OK(db->Put(WriteOptions(), Slice(keybuf), Slice(valbuf)));
    } else {
      // Read a value and verify that it matches the pattern written above.
      Status s = db->Get(ReadOptions(), Slice(keybuf), &value);
      if (s.IsNotFound()) {
        // Key has not yet been written
      } else {
        // Check that the writer thread counter is >= the counter in the value
        ASSERT_LEVELDB_OK(s);
        int k, w, c;
        ASSERT_EQ(3, sscanf(value.c_str(), "%d.%d.%d", &k, &w, &c)) << value;
        ASSERT_EQ(k, key);
        ASSERT_GE(w, 0);
        ASSERT_LT(w, kNumThreads);
        ASSERT_LE(c, t->state->counter[w].load(std::memory_order_acquire));
      }
    }
    counter++;
  }
  t->state->thread_done[id].store(true, std::memory_order_release);
  std::fprintf(stderr, "... stopping thread %d after %d ops\n", id, counter);
}